

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O1

void __thiscall CLayers::InitGameLayer(CLayers *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar5;
  CMapItemGroup *pCVar3;
  CMapItemLayerTilemap *pCVar4;
  
  if (0 < this->m_GroupsNum) {
    iVar5 = 0;
    do {
      iVar1 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                        (this->m_pMap,(ulong)(uint)(this->m_GroupsStart + iVar5),0,0);
      pCVar3 = (CMapItemGroup *)CONCAT44(extraout_var,iVar1);
      if (0 < (pCVar3->super_CMapItemGroup_v1).m_NumLayers) {
        iVar1 = 0;
        do {
          iVar2 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                            (this->m_pMap,
                             (ulong)(uint)((pCVar3->super_CMapItemGroup_v1).m_StartLayer +
                                           this->m_LayersStart + iVar1),0);
          pCVar4 = (CMapItemLayerTilemap *)CONCAT44(extraout_var_00,iVar2);
          if (((pCVar4->m_Layer).m_Type == 2) && ((pCVar4->m_Flags & 1) != 0)) {
            this->m_pGameLayer = pCVar4;
            this->m_pGameGroup = pCVar3;
            (pCVar3->super_CMapItemGroup_v1).m_OffsetX = 0;
            (pCVar3->super_CMapItemGroup_v1).m_OffsetY = 0;
            (pCVar3->super_CMapItemGroup_v1).m_ParallaxX = 100;
            (pCVar3->super_CMapItemGroup_v1).m_ParallaxY = 100;
            if ((pCVar3->super_CMapItemGroup_v1).m_Version < 2) {
              return;
            }
            pCVar3->m_UseClipping = 0;
            pCVar3->m_ClipX = 0;
            pCVar3->m_ClipY = 0;
            pCVar3->m_ClipW = 0;
            pCVar3->m_ClipH = 0;
            return;
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 < (pCVar3->super_CMapItemGroup_v1).m_NumLayers);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_GroupsNum);
  }
  return;
}

Assistant:

void CLayers::InitGameLayer()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = reinterpret_cast<CMapItemLayerTilemap *>(pLayer);
				if(pTilemap->m_Flags&TILESLAYERFLAG_GAME)
				{
					m_pGameLayer = pTilemap;
					m_pGameGroup = pGroup;

					// make sure the game group has standard settings
					m_pGameGroup->m_OffsetX = 0;
					m_pGameGroup->m_OffsetY = 0;
					m_pGameGroup->m_ParallaxX = 100;
					m_pGameGroup->m_ParallaxY = 100;

					if(m_pGameGroup->m_Version >= 2)
					{
						m_pGameGroup->m_UseClipping = 0;
						m_pGameGroup->m_ClipX = 0;
						m_pGameGroup->m_ClipY = 0;
						m_pGameGroup->m_ClipW = 0;
						m_pGameGroup->m_ClipH = 0;
					}

					return; // there can only be one game layer and game group
				}
			}
		}
	}
}